

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

void __thiscall Mat::addFrom_pos(Mat *this,char **p)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong *puVar5;
  reference pvVar6;
  char **in_RSI;
  int *in_RDI;
  int i;
  int l;
  int tmp_c;
  int tmp_r;
  long local_78;
  long local_70;
  long local_50;
  long local_48;
  int local_20;
  
  Constant::Util::char_to_int(in_RSI);
  Constant::Util::char_to_int(in_RSI);
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  for (local_20 = 0; local_20 < iVar1 * iVar2; local_20 = local_20 + 1) {
    uVar4 = Constant::Util::char_to_ll(in_RSI);
    puVar5 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                ((vector<__int128,_std::allocator<__int128>_> *)(in_RDI + 4),
                                 (long)local_20);
    puVar5[1] = puVar5[1] + ((long)uVar4 >> 0x3f) + (ulong)CARRY8(*puVar5,uVar4);
    *puVar5 = *puVar5 + uVar4;
    puVar5 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                ((vector<__int128,_std::allocator<__int128>_> *)(in_RDI + 4),
                                 (long)local_20);
    if ((long)puVar5[1] < (long)(ulong)(*puVar5 < 0x16345785d8a0003)) {
      pvVar6 = std::vector<__int128,_std::allocator<__int128>_>::operator[]
                         ((vector<__int128,_std::allocator<__int128>_> *)(in_RDI + 4),(long)local_20
                         );
      local_50 = (long)*pvVar6;
      local_48 = *(long *)((long)pvVar6 + 8);
    }
    else {
      puVar5 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                  ((vector<__int128,_std::allocator<__int128>_> *)(in_RDI + 4),
                                   (long)local_20);
      local_50 = *puVar5 + 0xfe9cba87a275fffd;
      local_48 = (puVar5[1] - 1) + (ulong)(0x16345785d8a0002 < *puVar5);
    }
    pvVar6 = std::vector<__int128,_std::allocator<__int128>_>::operator[]
                       ((vector<__int128,_std::allocator<__int128>_> *)(in_RDI + 4),(long)local_20);
    *(long *)((long)pvVar6 + 8) = local_48;
    *(long *)pvVar6 = local_50;
    puVar5 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                ((vector<__int128,_std::allocator<__int128>_> *)(in_RDI + 4),
                                 (long)local_20);
    lVar3 = -1 - puVar5[1];
    if ((SBORROW8(-1,puVar5[1]) != SBORROW8(lVar3,(ulong)(0xfe9cba87a275fffd < *puVar5))) ==
        (long)(lVar3 - (ulong)(0xfe9cba87a275fffd < *puVar5)) < 0) {
      puVar5 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                  ((vector<__int128,_std::allocator<__int128>_> *)(in_RDI + 4),
                                   (long)local_20);
      local_78 = *puVar5 + 0x16345785d8a0003;
      local_70 = puVar5[1] + (ulong)(0xfe9cba87a275fffc < *puVar5);
    }
    else {
      pvVar6 = std::vector<__int128,_std::allocator<__int128>_>::operator[]
                         ((vector<__int128,_std::allocator<__int128>_> *)(in_RDI + 4),(long)local_20
                         );
      local_78 = (long)*pvVar6;
      local_70 = *(long *)((long)pvVar6 + 8);
    }
    pvVar6 = std::vector<__int128,_std::allocator<__int128>_>::operator[]
                       ((vector<__int128,_std::allocator<__int128>_> *)(in_RDI + 4),(long)local_20);
    *(long *)((long)pvVar6 + 8) = local_70;
    *(long *)pvVar6 = local_78;
  }
  return;
}

Assistant:

void Mat::addFrom_pos(char *&p) {
    int tmp_r, tmp_c;
    tmp_r = Constant::Util::char_to_int(p);
    tmp_c = Constant::Util::char_to_int(p);
    int l = r * c;
//    cout << "l: " << l << endl;
    for (int i = 0; i < l; i++) {
        val[i] += Constant::Util::char_to_ll(p);
        val[i] = val[i] >= MOD ? val[i] - MOD : val[i];
        val[i] = val[i] <= -MOD ? val[i] + MOD : val[i];
    }
}